

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<SafeSymbols>::copyAppend
          (QGenericArrayOps<SafeSymbols> *this,SafeSymbols *b,SafeSymbols *e)

{
  SafeSymbols *pSVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  long lVar5;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<SafeSymbols>).ptr;
    lVar5 = (this->super_QArrayDataPointer<SafeSymbols>).size;
    do {
      pDVar2 = (b->symbols).d.d;
      pSVar1[lVar5].symbols.d.d = pDVar2;
      pSVar1[lVar5].symbols.d.ptr = (b->symbols).d.ptr;
      pSVar1[lVar5].symbols.d.size = (b->symbols).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar3 = (b->expandedMacro).d.d;
      pSVar1[lVar5].expandedMacro.d.d = pDVar3;
      pSVar1[lVar5].expandedMacro.d.ptr = (b->expandedMacro).d.ptr;
      pSVar1[lVar5].expandedMacro.d.size = (b->expandedMacro).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->excludedSymbols).q_hash.d;
      pSVar1[lVar5].excludedSymbols.q_hash.d = pDVar4;
      if ((pDVar4 != (Data *)0x0) &&
         ((pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar1[lVar5].index = b->index;
      b = b + 1;
      lVar5 = (this->super_QArrayDataPointer<SafeSymbols>).size + 1;
      (this->super_QArrayDataPointer<SafeSymbols>).size = lVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }